

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::RuntimeImp::checkGc(RuntimeImp *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  pointer pTVar4;
  Requester requester;
  uint *puVar5;
  uint local_4c;
  uint local_28 [4];
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  RuntimeImp *this_local;
  
  lock._M_device = (mutex_type *)this;
  _Var2 = std::__atomic_base<int>::operator--(&(this->gcWaitCount).super___atomic_base<int>,0);
  if (_Var2 == 0) {
    std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtGc);
    peVar3 = std::__shared_ptr_access<chatra::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->storage);
    bVar1 = Storage::tidy(peVar3,&this->super_IConcurrentGcConfiguration);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<chatra::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatra::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->storage);
      pTVar4 = std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::operator->
                         (&this->gcThread);
      requester = IdType<chatra::Requester,_chatra::Thread>::getId
                            (&pTVar4->super_IdType<chatra::Requester,_chatra::Thread>);
      Storage::collect(peVar3,requester);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
    if ((this->multiThread & 1U) == 0) {
      local_4c = 1;
    }
    else {
      local_28[0] = 1;
      puVar5 = std::max<unsigned_int>(local_28,&this->targetWorkerThreads);
      local_4c = *puVar5;
    }
    std::__atomic_base<int>::operator=(&(this->gcWaitCount).super___atomic_base<int>,local_4c * 100)
    ;
  }
  return;
}

Assistant:

void RuntimeImp::checkGc() {
	if (gcWaitCount-- != 0)
		return;

	{
		std::lock_guard<std::mutex> lock(mtGc);
		if (storage->tidy(*this))
			storage->collect(gcThread->getId());
	}

	gcWaitCount = 100 * (multiThread ? std::max(1U, targetWorkerThreads) : 1);
}